

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

Var __thiscall
InlineeFrameRecord::Restore
          (InlineeFrameRecord *this,int offset,bool isFloat64,bool isInt32,
          JavascriptCallStackLayout *layout,FunctionBody *functionBody,bool boxValue)

{
  code *pcVar1;
  bool bVar2;
  int32 iVar3;
  uint nValue;
  uint uVar4;
  LocalFunctionId LVar5;
  undefined4 *puVar6;
  ScriptContext *pSVar7;
  Var pvVar8;
  double value_00;
  Var oldValue;
  int32 int32Value;
  double dblValue;
  Var pvStack_50;
  bool boxStackInstance;
  Var value;
  bool boxValue_local;
  FunctionBody *functionBody_local;
  JavascriptCallStackLayout *layout_local;
  bool isInt32_local;
  bool isFloat64_local;
  int offset_local;
  InlineeFrameRecord *this_local;
  Var local_10;
  
  dblValue._7_1_ = boxValue;
  if (offset < 0) {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
      if (bVar2) {
        Output::Print(L"Stack offset %10d",(ulong)(uint)offset);
      }
    }
    if (isFloat64) {
      value_00 = Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
      pSVar7 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pvStack_50 = Js::JavascriptNumber::New(value_00,pSVar7);
      if ((DAT_01ec73ca & 1) != 0) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
        if (bVar2) {
          Output::Print(L", value: %f (ToVar: 0x%p)",value_00,pvStack_50);
        }
      }
    }
    else if (isInt32) {
      iVar3 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
      pvStack_50 = (Var)(long)iVar3;
    }
    else {
      pvStack_50 = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
    }
  }
  else {
    if (this->constantCount <= (uint)offset) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x14a,"(static_cast<uint>(offset) < constantCount)",
                         "static_cast<uint>(offset) < constantCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pvStack_50 = this->constants[offset];
    dblValue._7_1_ = 0;
  }
  if (isInt32) {
    nValue = Math::PointerCastToIntegralTruncate<int>(pvStack_50);
    pSVar7 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
    bVar2 = Js::TaggedInt::IsOverflow(nValue);
    if (bVar2) {
      local_10 = Js::JavascriptNumber::NewInlined((double)(int)nValue,pSVar7);
    }
    else {
      local_10 = Js::TaggedInt::ToVarUnchecked(nValue);
    }
    pvStack_50 = local_10;
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
      if (bVar2) {
        Output::Print(L", value: %10d (ToVar: 0x%p)",(ulong)nValue,local_10);
      }
    }
  }
  else {
    if ((DAT_01ec73ca & 1) != 0) {
      uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
      LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
      if (bVar2) {
        Output::Print(L", value: 0x%p",pvStack_50);
      }
    }
    if ((dblValue._7_1_ & 1) != 0) {
      pSVar7 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
      pvVar8 = Js::JavascriptOperators::BoxStackInstance(pvStack_50,pSVar7,true,false);
      bVar2 = pvStack_50 != pvVar8;
      pvStack_50 = pvVar8;
      if ((bVar2) && ((DAT_01ec73ca & 1) != 0)) {
        uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
        LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
        if (bVar2) {
          Output::Print(L" (Boxed: 0x%p)",pvVar8);
        }
      }
    }
  }
  if ((DAT_01ec73ca & 1) != 0) {
    uVar4 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)functionBody);
    LVar5 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)functionBody);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailOutPhase,uVar4,LVar5);
    if (bVar2) {
      Output::Print(L"\n");
    }
  }
  return pvStack_50;
}

Assistant:

Js::Var InlineeFrameRecord::Restore(int offset, bool isFloat64, bool isInt32, Js::JavascriptCallStackLayout * layout, Js::FunctionBody* functionBody, bool boxValue) const
{
    Js::Var value;
    bool boxStackInstance = boxValue;
    double dblValue;
    if (offset >= 0)
    {
        Assert(static_cast<uint>(offset) < constantCount);
        value = this->constants[offset];
        boxStackInstance = false;
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u("Stack offset %10d"), offset);
        if (isFloat64)
        {
            dblValue = layout->GetDoubleAtOffset(offset);
            value = Js::JavascriptNumber::New(dblValue, functionBody->GetScriptContext());
            BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
        }
        else if (isInt32)
        {
            value = (Js::Var)layout->GetInt32AtOffset(offset);
        }
        else
        {
            value = layout->GetOffset(offset);
        }
    }

    if (isInt32)
    {
        int32 int32Value = ::Math::PointerCastToIntegralTruncate<int32>(value);
        value = Js::JavascriptNumber::ToVar(int32Value, functionBody->GetScriptContext());
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(functionBody, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            // Do not deepCopy in this call to BoxStackInstance because this should be used for
            // bailing out, where a shallow copy that is cached is needed to ensure that multiple
            // vars pointing to the same boxed object reuse the new boxed value.
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, functionBody->GetScriptContext(), /* allowStackFunction */ true, false /* deepCopy */);

#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(functionBody, _u(" (Boxed: 0x%p)"), value);
            }
#endif
        }
    }
    BAILOUT_VERBOSE_TRACE(functionBody, _u("\n"));
    return value;
}